

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

bool __thiscall
BlockFilterIndex::ReadFilterFromDisk
          (BlockFilterIndex *this,FlatFilePos *pos,uint256 *hash,BlockFilter *filter)

{
  pointer puVar1;
  pointer puVar2;
  void *pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_00;
  undefined1 auVar4 [16];
  BlockFilter *__nbytes;
  bool bVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Span<unsigned_char> output;
  string_view logging_function;
  string_view source_file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  uint256 result;
  uint256 block_hash;
  Level in_stack_fffffffffffffed8;
  undefined4 uVar8;
  undefined4 uVar9;
  char *in_stack_fffffffffffffee0;
  pointer puVar10;
  undefined1 local_108 [16];
  pointer local_f8;
  undefined1 local_e8 [24];
  pointer local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  pointer local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = filter;
  local_e8._0_8_ =
       FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                         super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>._M_t.
                         super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
                         super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,true);
  local_e8._8_16_ = (undefined1  [16])0x0;
  local_d0 = (pointer)0x0;
  if ((FILE *)local_e8._0_8_ == (FILE *)0x0) {
    bVar5 = false;
  }
  else {
    local_a8._16_16_ = (undefined1  [16])0x0;
    local_a8._0_16_ = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    local_f8 = (pointer)0x0;
    AutoFile::read((AutoFile *)local_e8,(int)local_a8,(void *)0x20,(size_t)__nbytes);
    AutoFile::operator>>
              ((AutoFile *)local_e8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
    local_b8 = (undefined1  [16])0x0;
    local_c8 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_28 = (pointer)0x0;
    CSHA256::CSHA256((CSHA256 *)local_88);
    CSHA256::Write((CSHA256 *)local_88,(uchar *)local_108._0_8_,local_108._8_8_ - local_108._0_8_);
    output.m_size = 0x20;
    output.m_data = local_c8;
    CHash256::Finalize((CHash256 *)local_88,output);
    puVar10 = local_f8;
    auVar4 = local_108;
    auVar7[0] = -((hash->super_base_blob<256U>).m_data._M_elems[0x10] == local_b8[0]);
    auVar7[1] = -((hash->super_base_blob<256U>).m_data._M_elems[0x11] == local_b8[1]);
    auVar7[2] = -((hash->super_base_blob<256U>).m_data._M_elems[0x12] == local_b8[2]);
    auVar7[3] = -((hash->super_base_blob<256U>).m_data._M_elems[0x13] == local_b8[3]);
    auVar7[4] = -((hash->super_base_blob<256U>).m_data._M_elems[0x14] == local_b8[4]);
    auVar7[5] = -((hash->super_base_blob<256U>).m_data._M_elems[0x15] == local_b8[5]);
    auVar7[6] = -((hash->super_base_blob<256U>).m_data._M_elems[0x16] == local_b8[6]);
    auVar7[7] = -((hash->super_base_blob<256U>).m_data._M_elems[0x17] == local_b8[7]);
    auVar7[8] = -((hash->super_base_blob<256U>).m_data._M_elems[0x18] == local_b8[8]);
    auVar7[9] = -((hash->super_base_blob<256U>).m_data._M_elems[0x19] == local_b8[9]);
    auVar7[10] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1a] == local_b8[10]);
    auVar7[0xb] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1b] == local_b8[0xb]);
    auVar7[0xc] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1c] == local_b8[0xc]);
    auVar7[0xd] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1d] == local_b8[0xd]);
    auVar7[0xe] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1e] == local_b8[0xe]);
    auVar7[0xf] = -((hash->super_base_blob<256U>).m_data._M_elems[0x1f] == local_b8[0xf]);
    auVar6[0] = -((hash->super_base_blob<256U>).m_data._M_elems[0] == local_c8[0]);
    auVar6[1] = -((hash->super_base_blob<256U>).m_data._M_elems[1] == local_c8[1]);
    auVar6[2] = -((hash->super_base_blob<256U>).m_data._M_elems[2] == local_c8[2]);
    auVar6[3] = -((hash->super_base_blob<256U>).m_data._M_elems[3] == local_c8[3]);
    auVar6[4] = -((hash->super_base_blob<256U>).m_data._M_elems[4] == local_c8[4]);
    auVar6[5] = -((hash->super_base_blob<256U>).m_data._M_elems[5] == local_c8[5]);
    auVar6[6] = -((hash->super_base_blob<256U>).m_data._M_elems[6] == local_c8[6]);
    auVar6[7] = -((hash->super_base_blob<256U>).m_data._M_elems[7] == local_c8[7]);
    auVar6[8] = -((hash->super_base_blob<256U>).m_data._M_elems[8] == local_c8[8]);
    auVar6[9] = -((hash->super_base_blob<256U>).m_data._M_elems[9] == local_c8[9]);
    auVar6[10] = -((hash->super_base_blob<256U>).m_data._M_elems[10] == local_c8[10]);
    auVar6[0xb] = -((hash->super_base_blob<256U>).m_data._M_elems[0xb] == local_c8[0xb]);
    auVar6[0xc] = -((hash->super_base_blob<256U>).m_data._M_elems[0xc] == local_c8[0xc]);
    auVar6[0xd] = -((hash->super_base_blob<256U>).m_data._M_elems[0xd] == local_c8[0xd]);
    auVar6[0xe] = -((hash->super_base_blob<256U>).m_data._M_elems[0xe] == local_c8[0xe]);
    auVar6[0xf] = -((hash->super_base_blob<256U>).m_data._M_elems[0xf] == local_c8[0xf]);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
      uVar8 = local_108._0_4_;
      uVar9 = local_108._4_4_;
      local_108 = (undefined1  [16])0x0;
      auVar6 = local_108;
      local_f8 = (pointer)0x0;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar10;
      local_108._0_8_ = auVar4._0_8_;
      local_108._8_8_ = auVar4._8_8_;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_108._0_8_;
      filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_108._8_8_;
      local_108 = auVar6;
      BlockFilter::BlockFilter
                ((BlockFilter *)local_88,this->m_filter_type,(uint256 *)local_a8,filter_00,
                 SUB81(&stack0xfffffffffffffed8,0));
      auVar6 = local_58;
      auVar4 = local_88;
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0x1f] = local_68[0];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0xf) =
           local_78._0_8_;
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 0x17) =
           local_78._8_8_;
      filter->m_filter_type = local_88[0];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[0] = local_88[1];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[1] = local_88[2];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[2] = local_88[3];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[3] = local_88[4];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[4] = local_88[5];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[5] = local_88[6];
      (filter->m_block_hash).super_base_blob<256U>.m_data._M_elems[6] = local_88[7];
      *(undefined8 *)((filter->m_block_hash).super_base_blob<256U>.m_data._M_elems + 7) =
           local_88._8_8_;
      (filter->m_filter).m_params.m_siphash_k0 = local_68._8_8_;
      (filter->m_filter).m_params.m_siphash_k1 = local_58._0_8_;
      (filter->m_filter).m_params.m_P = local_58[8];
      *(undefined3 *)&(filter->m_filter).m_params.field_0x11 = local_58._9_3_;
      (filter->m_filter).m_params.m_M = local_58._12_4_;
      *(undefined8 *)&(filter->m_filter).m_N = local_48._0_8_;
      (filter->m_filter).m_F = local_48._8_8_;
      puVar1 = (filter->m_filter).m_encoded.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (filter->m_filter).m_encoded.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (filter->m_filter).m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38._0_8_;
      (filter->m_filter).m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
      (filter->m_filter).m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
      local_38 = (undefined1  [16])0x0;
      local_28 = (pointer)0x0;
      local_88 = auVar4;
      local_58 = auVar6;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
        if ((pointer)local_38._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
        }
      }
      pvVar3 = (void *)CONCAT44(uVar9,uVar8);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)puVar10 - (long)pvVar3);
      }
      bVar5 = true;
    }
    else {
      logging_function._M_str = "ReadFilterFromDisk";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 99;
      ::LogPrintf_<>(logging_function,source_file,0xb0,IPC|COINDB|RAND|CMPCTBLOCK|ADDRMAN|BENCH|NET,
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      bVar5 = false;
    }
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
    }
  }
  AutoFile::~AutoFile((AutoFile *)local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::ReadFilterFromDisk(const FlatFilePos& pos, const uint256& hash, BlockFilter& filter) const
{
    AutoFile filein{m_filter_fileseq->Open(pos, true)};
    if (filein.IsNull()) {
        return false;
    }

    // Check that the hash of the encoded_filter matches the one stored in the db.
    uint256 block_hash;
    std::vector<uint8_t> encoded_filter;
    try {
        filein >> block_hash >> encoded_filter;
        if (Hash(encoded_filter) != hash) {
            LogError("Checksum mismatch in filter decode.\n");
            return false;
        }
        filter = BlockFilter(GetFilterType(), block_hash, std::move(encoded_filter), /*skip_decode_check=*/true);
    }
    catch (const std::exception& e) {
        LogError("%s: Failed to deserialize block filter from disk: %s\n", __func__, e.what());
        return false;
    }

    return true;
}